

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environ.cpp
# Opt level: O0

LPSTR GetEnvironmentStringsA(void)

{
  int iVar1;
  size_t sVar2;
  LPSTR pCVar3;
  int local_24;
  int envNum;
  int len;
  int i;
  char *tempEnviron;
  char *environ;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  PALCEnterCriticalSection(&gcsEnvironment);
  local_24 = 0;
  for (envNum = 0; palEnvironment[envNum] != (char *)0x0; envNum = envNum + 1) {
    sVar2 = strlen(palEnvironment[envNum]);
    local_24 = (int)sVar2 + 1 + local_24;
  }
  pCVar3 = (LPSTR)PAL_malloc((long)(local_24 + 1));
  if (pCVar3 == (LPSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    SetLastError(8);
  }
  else {
    _len = pCVar3;
    for (envNum = 0; palEnvironment[envNum] != (char *)0x0; envNum = envNum + 1) {
      sVar2 = strlen(palEnvironment[envNum]);
      iVar1 = (int)sVar2 + 1;
      memcpy(_len,palEnvironment[envNum],(long)iVar1);
      _len = _len + iVar1;
    }
    *_len = '\0';
  }
  PALCLeaveCriticalSection(&gcsEnvironment);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pCVar3;
}

Assistant:

LPSTR
PALAPI
GetEnvironmentStringsA(
               VOID)
{
    char *environ = NULL, *tempEnviron;
    int i, len, envNum;

    PERF_ENTRY(GetEnvironmentStringsA);
    ENTRY("GetEnvironmentStringsA()\n");

    PALCEnterCriticalSection(&gcsEnvironment);    

    envNum = 0;
    len    = 0;

    /* get total length of the bytes that we need to allocate */
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        envNum += len;
    }

    environ = (char *)PAL_malloc(envNum + 1);
    if (environ == NULL)
    {
        ERROR("malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto EXIT;
    }

    len = 0;
    tempEnviron = environ;
    for (i = 0; palEnvironment[i] != 0; i++)
    {
        len = strlen(palEnvironment[i]) + 1;
        memcpy(tempEnviron, palEnvironment[i], len);
        tempEnviron += len;
        envNum      -= len;
    }

    *tempEnviron = 0; /* Put an extra NULL at the end */
    
 EXIT:
    PALCLeaveCriticalSection(&gcsEnvironment);

    LOGEXIT("GetEnvironmentStringsA returning %p\n", environ);
    PERF_EXIT(GetEnvironmentStringsA);
    return environ;
}